

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

void calc_sad_update_bestmv_with_indices
               (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,MV_COST_PARAMS *mv_cost_params,
               FULLPEL_MV *best_mv,FULLPEL_MV center_mv,uint8_t *center_address,uint *bestsad,
               uint *raw_bestsad,int search_step,int *best_site,int num_candidates,
               int *chkpts_indices,int *cost_list)

{
  FULLPEL_MV mv;
  int iVar1;
  buf_2d *src_00;
  undefined4 in_ECX;
  long in_RDI;
  FULLPEL_MV *in_R9;
  int found_better_mv;
  int thissad;
  FULLPEL_MV this_mv;
  int index;
  int i;
  search_site *site;
  buf_2d *ref;
  buf_2d *src;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int iVar2;
  int iVar3;
  FULLPEL_MOTION_SEARCH_PARAMS *ms_params_00;
  short local_4;
  short sStack_2;
  
  ms_params_00 = *(FULLPEL_MOTION_SEARCH_PARAMS **)(in_RDI + 0x10);
  src_00 = (buf_2d *)(*(long *)(in_RDI + 0x50) + (long)thissad * 0x88);
  for (iVar3 = 0; iVar3 < (int)site; iVar3 = iVar3 + 1) {
    iVar2 = *(int *)((long)&ref->buf + (long)iVar3 * 4);
    local_4 = (short)in_ECX;
    local_4 = local_4 + *(short *)(&src_00->buf + iVar2);
    sStack_2 = (short)((uint)in_ECX >> 0x10);
    sStack_2 = sStack_2 + *(short *)((long)&src_00->buf + (long)iVar2 * 8 + 2);
    mv.col = sStack_2;
    mv.row = local_4;
    iVar1 = av1_is_fullmv_in_range((FullMvLimits *)(in_RDI + 0x58),mv);
    if (iVar1 == 0) {
      if (src != (buf_2d *)0x0) {
        *(undefined4 *)((long)&src->buf + (long)(iVar2 + 1) * 4) = 0x7fffffff;
      }
    }
    else {
      iVar1 = get_mvpred_sad(ms_params_00,src_00,(uint8_t *)CONCAT44(iVar3,iVar2),
                             CONCAT22(sStack_2,local_4));
      if (src != (buf_2d *)0x0) {
        *(int *)((long)&src->buf + (long)(iVar2 + 1) * 4) = iVar1;
      }
      in_stack_ffffffffffffffa4 =
           update_mvs_and_sad((uint)ms_params_00,(FULLPEL_MV *)src_00,
                              (MV_COST_PARAMS *)CONCAT44(iVar3,iVar2),
                              (uint *)CONCAT26(sStack_2,CONCAT24(local_4,iVar1)),
                              (uint *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (FULLPEL_MV *)0x0,in_R9);
      if (in_stack_ffffffffffffffa4 != 0) {
        *_index = iVar3;
      }
    }
  }
  return;
}

Assistant:

static inline void calc_sad_update_bestmv_with_indices(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
    const MV_COST_PARAMS *mv_cost_params, FULLPEL_MV *best_mv,
    const FULLPEL_MV center_mv, const uint8_t *center_address,
    unsigned int *bestsad, unsigned int *raw_bestsad, int search_step,
    int *best_site, const int num_candidates, const int *chkpts_indices,
    int *cost_list) {
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site *site = ms_params->search_sites->site[search_step];
  // Loop over number of candidates.
  for (int i = 0; i < num_candidates; i++) {
    int index = chkpts_indices[i];
    const FULLPEL_MV this_mv = { center_mv.row + site[index].mv.row,
                                 center_mv.col + site[index].mv.col };
    if (!av1_is_fullmv_in_range(&ms_params->mv_limits, this_mv)) {
      if (cost_list) {
        cost_list[index + 1] = INT_MAX;
      }
      continue;
    }
    const int thissad = get_mvpred_sad(
        ms_params, src, center_address + site[index].offset, ref->stride);
    if (cost_list) {
      cost_list[index + 1] = thissad;
    }
    const int found_better_mv = update_mvs_and_sad(
        thissad, &this_mv, mv_cost_params, bestsad, raw_bestsad, best_mv,
        /*second_best_mv=*/NULL);
    if (found_better_mv) *best_site = i;
  }
}